

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O1

int __thiscall anon_unknown.dwarf_e23c::AudioState::getSync(AudioState *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  nanoseconds nVar3;
  nanoseconds nVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  
  iVar6 = 0;
  if (this->mMovie->mAVSyncType != Audio) {
    nVar3 = MovieState::getMasterClock(this->mMovie);
    nVar4 = getClockNoLock(this);
    dVar2 = (anonymous_namespace)::AudioAvgFilterCoeff;
    lVar7 = nVar3.__r - nVar4.__r;
    iVar6 = 0;
    if (lVar7 - 10000000000U < 0xfffffffb57e83801) {
      (this->mClockDiffAvg).__r = 0.0;
    }
    else {
      dVar8 = ((double)lVar7 +
              (this->mClockDiffAvg).__r * (anonymous_namespace)::AudioAvgFilterCoeff * 1000000000.0)
              / 1000000000.0;
      (this->mClockDiffAvg).__r = dVar8;
      dVar8 = (1.0 - dVar2) * dVar8;
      if ((0.015 <= dVar8) || (dVar8 <= -0.03)) {
        lVar5 = 50000000;
        if (lVar7 < 50000000) {
          lVar5 = lVar7;
        }
        auVar1 = SEXT816(((this->mCodecCtx)._M_t.
                          super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                          .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl)->sample_rate
                         * lVar5) * SEXT816(0x112e0be826d694b3);
        iVar6 = (int)(auVar1._8_8_ >> 0x1a) - (auVar1._12_4_ >> 0x1f);
      }
    }
  }
  return iVar6;
}

Assistant:

int AudioState::getSync()
{
    if(mMovie.mAVSyncType == SyncMaster::Audio)
        return 0;

    auto ref_clock = mMovie.getMasterClock();
    auto diff = ref_clock - getClockNoLock();

    if(!(diff < AVNoSyncThreshold && diff > -AVNoSyncThreshold))
    {
        /* Difference is TOO big; reset accumulated average */
        mClockDiffAvg = seconds_d64::zero();
        return 0;
    }

    /* Accumulate the diffs */
    mClockDiffAvg = mClockDiffAvg*AudioAvgFilterCoeff + diff;
    auto avg_diff = mClockDiffAvg*(1.0 - AudioAvgFilterCoeff);
    if(avg_diff < AudioSyncThreshold/2.0 && avg_diff > -AudioSyncThreshold)
        return 0;

    /* Constrain the per-update difference to avoid exceedingly large skips */
    diff = std::min<nanoseconds>(diff, AudioSampleCorrectionMax);
    return static_cast<int>(duration_cast<seconds>(diff*mCodecCtx->sample_rate).count());
}